

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O3

int __thiscall vkt::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *pTVar3;
  int extraout_EAX;
  TestGroupHelper0 *pTVar4;
  TestNode *pTVar5;
  string local_68;
  string local_48;
  
  pTVar3 = (this->super_TestPackage).super_TestNode.m_testCtx;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"info","");
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Build and Device Info Tests","");
  pTVar4 = (TestGroupHelper0 *)operator_new(0x78);
  TestGroupHelper0::TestGroupHelper0(pTVar4,pTVar3,&local_48,&local_68,createInfoTests);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = &api::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &vkt::memory::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &pipeline::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &BindingModel::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &SpirVAssembly::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar3 = (this->super_TestPackage).super_TestNode.m_testCtx;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"glsl","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"GLSL shader execution tests","");
  pTVar4 = (TestGroupHelper0 *)operator_new(0x78);
  TestGroupHelper0::TestGroupHelper0(pTVar4,pTVar3,&local_48,&local_68,createGlslTests);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = &createRenderPassTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &ubo::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &DynamicState::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &ssbo::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &QueryPool::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &Draw::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &compute::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &vkt::image::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &wsi::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &synchronization::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &sparse::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &tessellation::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &rasterization::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &clipping::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &FragmentOperations::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &vkt::texture::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = &geometry::createTests((this->super_TestPackage).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	addChild(createTestGroup				(m_testCtx, "info", "Build and Device Info Tests", createInfoTests));
	addChild(api::createTests				(m_testCtx));
	addChild(memory::createTests			(m_testCtx));
	addChild(pipeline::createTests			(m_testCtx));
	addChild(BindingModel::createTests		(m_testCtx));
	addChild(SpirVAssembly::createTests		(m_testCtx));
	addChild(createTestGroup				(m_testCtx, "glsl", "GLSL shader execution tests", createGlslTests));
	addChild(createRenderPassTests			(m_testCtx));
	addChild(ubo::createTests				(m_testCtx));
	addChild(DynamicState::createTests		(m_testCtx));
	addChild(ssbo::createTests				(m_testCtx));
	addChild(QueryPool::createTests			(m_testCtx));
	addChild(Draw::createTests				(m_testCtx));
	addChild(compute::createTests			(m_testCtx));
	addChild(image::createTests				(m_testCtx));
	addChild(wsi::createTests				(m_testCtx));
	addChild(synchronization::createTests	(m_testCtx));
	addChild(sparse::createTests			(m_testCtx));
	addChild(tessellation::createTests		(m_testCtx));
	addChild(rasterization::createTests		(m_testCtx));
	addChild(clipping::createTests			(m_testCtx));
	addChild(FragmentOperations::createTests(m_testCtx));
	addChild(texture::createTests			(m_testCtx));
	addChild(geometry::createTests			(m_testCtx));
}